

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O1

SpecialProperties Catch::anon_unknown_1::parseSpecialTag(string *tag)

{
  int iVar1;
  SpecialProperties SVar2;
  
  if ((tag->_M_string_length == 0) || (SVar2 = IsHidden, *(tag->_M_dataplus)._M_p != '.')) {
    iVar1 = std::__cxx11::string::compare((char *)tag);
    if (iVar1 == 0) {
      SVar2 = IsHidden;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)tag);
      if (iVar1 == 0) {
        SVar2 = Throws;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)tag);
        if (iVar1 == 0) {
          SVar2 = ShouldFail;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)tag);
          if (iVar1 == 0) {
            SVar2 = MayFail;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)tag);
            if (iVar1 == 0) {
              SVar2 = NonPortable;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)tag);
              SVar2 = Benchmark|IsHidden;
              if (iVar1 != 0) {
                SVar2 = None;
              }
            }
          }
        }
      }
    }
  }
  return SVar2;
}

Assistant:

TestCaseInfo::SpecialProperties parseSpecialTag( std::string const& tag ) {
            if( startsWith( tag, '.' ) ||
                tag == "!hide" )
                return TestCaseInfo::IsHidden;
            else if( tag == "!throws" )
                return TestCaseInfo::Throws;
            else if( tag == "!shouldfail" )
                return TestCaseInfo::ShouldFail;
            else if( tag == "!mayfail" )
                return TestCaseInfo::MayFail;
            else if( tag == "!nonportable" )
                return TestCaseInfo::NonPortable;
            else if( tag == "!benchmark" )
                return static_cast<TestCaseInfo::SpecialProperties>( TestCaseInfo::Benchmark | TestCaseInfo::IsHidden );
            else
                return TestCaseInfo::None;
        }